

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

bool RigidBodyDynamics::CalcAssemblyQ
               (Model *model,VectorNd *QInit,ConstraintSet *cs,VectorNd *Q,VectorNd *weights,
               double tolerance,uint max_iter)

{
  double dVar1;
  ulong uVar2;
  undefined8 uVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  Model *this;
  string *psVar7;
  reference pvVar8;
  long in_RDI;
  uint in_R9D;
  double in_XMM0_Qa;
  RealScalar RVar9;
  size_t j;
  uint qIdx;
  Vector3d omega;
  Quaternion quat;
  size_t i_1;
  uint it;
  uint i;
  VectorNd e;
  VectorNd d;
  VectorNd x;
  VectorNd b;
  MatrixNd A;
  MatrixNd constraintJac;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffb78;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb80;
  MatrixNd *in_stack_fffffffffffffb88;
  ConstraintSet *in_stack_fffffffffffffb90;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffb98;
  Model *in_stack_fffffffffffffba0;
  VectorNd *in_stack_fffffffffffffba8;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  uint i_00;
  Model *in_stack_fffffffffffffbc0;
  VectorNd *local_370;
  Vector3d *in_stack_fffffffffffffcf0;
  Quaternion *in_stack_fffffffffffffcf8;
  string *local_2c8;
  uint local_1c4;
  uint local_1bc;
  LinearSolver in_stack_ffffffffffffff3c;
  VectorNd *in_stack_ffffffffffffff40;
  VectorNd *in_stack_ffffffffffffff48;
  MatrixNd *in_stack_ffffffffffffff50;
  bool local_1;
  
  uVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80
                    );
  if (uVar2 != *(uint *)(in_RDI + 0x4c)) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  uVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80
                    );
  if (uVar2 != *(uint *)(in_RDI + 0x4c)) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  uVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80
                    );
  if (uVar2 != *(uint *)(in_RDI + 0x48)) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  ConstraintSet::size((ConstraintSet *)0x6d8d62);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffba0,
             (unsigned_long *)in_stack_fffffffffffffb98,(uint *)in_stack_fffffffffffffb90);
  ConstraintSet::size((ConstraintSet *)0x6d8d98);
  ConstraintSet::size((ConstraintSet *)0x6d8dcd);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffffb88,(Index)in_stack_fffffffffffffb80);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffb78);
  ConstraintSet::size((ConstraintSet *)0x6d8e28);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb78);
  ConstraintSet::size((ConstraintSet *)0x6d8e7b);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb78);
  ConstraintSet::size((ConstraintSet *)0x6d8f01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb78);
  for (local_1bc = 0;
      IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffffb80), (long)(ulong)local_1bc < IVar4;
      local_1bc = local_1bc + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
    dVar1 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78,0x6d8fc2);
    *pSVar6 = dVar1;
  }
  CalcConstraintsPositionError
            (in_stack_fffffffffffffba0,(VectorNd *)in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90,(VectorNd *)in_stack_fffffffffffffb88,
             SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
  RVar9 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    (in_stack_fffffffffffffb78);
  if (in_XMM0_Qa <= RVar9) {
    for (local_1c4 = 0; local_1c4 < in_R9D; local_1c4 = local_1c4 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                (in_stack_fffffffffffffb80);
      CalcConstraintsJacobian
                (in_stack_fffffffffffffba0,(VectorNd *)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      ConstraintSet::size((ConstraintSet *)0x6d919e);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_long,unsigned_int>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbc0,
                 (Index)in_stack_fffffffffffffbb8,(Index)in_stack_fffffffffffffbb0,
                 (unsigned_long)in_stack_fffffffffffffba8,
                 (uint)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffffb80,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb78);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb78);
      ConstraintSet::size((ConstraintSet *)0x6d9235);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,unsigned_long>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbc0,
                 (Index)in_stack_fffffffffffffbb8,(Index)in_stack_fffffffffffffbb0,
                 (uint)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                 (unsigned_long)in_stack_fffffffffffffba0);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffffb80,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 in_stack_fffffffffffffb78);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator-
                (in_stack_fffffffffffffb98);
      in_stack_fffffffffffffbc0 = (Model *)(ulong)*(uint *)(in_RDI + 0x48);
      this = (Model *)ConstraintSet::size((ConstraintSet *)0x6d92b1);
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_long,int>
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffbc0,
                 (Index)in_stack_fffffffffffffbb8,(Index)in_stack_fffffffffffffbb0,
                 (unsigned_long)in_stack_fffffffffffffba8,
                 (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
                 in_stack_fffffffffffffb80,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_fffffffffffffb78);
      SolveLinearSystem(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_int,int>
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffbc0,
                 (Index)in_stack_fffffffffffffbb8,(Index)in_stack_fffffffffffffbb0,
                 (uint)((ulong)in_stack_fffffffffffffba8 >> 0x20),(int)in_stack_fffffffffffffba8);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
                 in_stack_fffffffffffffb78);
      local_2c8 = (string *)0x0;
      while (in_stack_fffffffffffffbb8 = local_2c8,
            psVar7 = (string *)
                     std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0)), in_stack_fffffffffffffbb8 < psVar7) {
        pvVar8 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)(in_RDI + 0xa0),(size_type)local_2c8);
        if (pvVar8->mJointType == JointTypeSpherical) {
          Model::GetQuaternion
                    (this,(uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                     (VectorNd *)in_stack_fffffffffffffbb8);
          i_00 = (uint)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(in_RDI + 0xa0),(size_type)local_2c8);
          Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb90
                     ,(Index)in_stack_fffffffffffffb88,(Index)in_stack_fffffffffffffb80);
          Vector3_t::Vector3_t<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
                    ((Vector3_t *)in_stack_fffffffffffffb80,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)in_stack_fffffffffffffb78);
          Math::Quaternion::omegaToQDot(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffba0,
                     (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffb98)
          ;
          in_stack_fffffffffffffbb0 =
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                          in_stack_fffffffffffffb78);
          Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
                    (in_stack_fffffffffffffbb0,(Scalar *)in_stack_fffffffffffffba8);
          Model::SetQuaternion
                    (in_stack_fffffffffffffbc0,i_00,(Quaternion *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8);
        }
        else {
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(in_RDI + 0xa0),(size_type)local_2c8);
          local_370 = (VectorNd *)0x0;
          while (in_stack_fffffffffffffba8 = local_370,
                pvVar8 = std::
                         vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                       *)(in_RDI + 0xa0),(size_type)local_2c8),
                in_stack_fffffffffffffba8 < (VectorNd *)(ulong)pvVar8->mDoFCount) {
            in_stack_fffffffffffffba0 =
                 (Model *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                          operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                     in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
            in_stack_fffffffffffffb90 =
                 (ConstraintSet *)
                 (in_stack_fffffffffffffba0->lambda).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            in_stack_fffffffffffffb98 =
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
            *(double *)in_stack_fffffffffffffb98 =
                 (double)in_stack_fffffffffffffb90 + *(double *)in_stack_fffffffffffffb98;
            local_370 = (VectorNd *)
                        ((long)&(local_370->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_data + 1);
          }
        }
        local_2c8 = (string *)&local_2c8->field_0x1;
      }
      CalcConstraintsPositionError
                (in_stack_fffffffffffffba0,(VectorNd *)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,(VectorNd *)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      in_stack_fffffffffffffb88 =
           (MatrixNd *)
           Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                     (in_stack_fffffffffffffb78);
      if (((double)in_stack_fffffffffffffb88 < in_XMM0_Qa) &&
         (in_stack_fffffffffffffb80 =
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                         (in_stack_fffffffffffffb78), (double)in_stack_fffffffffffffb80 < in_XMM0_Qa
         )) {
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
                   (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb78);
        local_1 = true;
        goto LAB_006d96e9;
      }
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb78);
    local_1 = false;
  }
  else {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb78);
    local_1 = true;
  }
LAB_006d96e9:
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6d96f6);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6d9703);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6d9710);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6d971d);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6d972a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6d9737);
  return local_1;
}

Assistant:

RBDL_DLLAPI
bool CalcAssemblyQ (
  Model &model,
  Math::VectorNd QInit, // Note: passed by value intentionally
  ConstraintSet &cs,
  Math::VectorNd &Q,
  const Math::VectorNd &weights,
  double tolerance,
  unsigned int max_iter
)
{

  if(Q.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect Q vector size.\n");
  }
  if(QInit.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect QInit vector size.\n");
  }
  if(weights.size() != model.dof_count) {
    throw Errors::RBDLDofMismatchError("Incorrect weights vector size.\n");
  }

  // Initialize variables.
  MatrixNd constraintJac (cs.size(), model.dof_count);
  MatrixNd A = MatrixNd::Zero (cs.size() + model.dof_count, cs.size()
                               + model.dof_count);
  VectorNd b = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd x = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd d = VectorNd::Zero (model.dof_count);
  VectorNd e = VectorNd::Zero (cs.size());

  // The top-left block is the weight matrix and is constant.
  for(unsigned int i = 0; i < weights.size(); ++i) {
    A(i,i) = weights[i];
  }

  // Check if the error is small enough already. If so, just return the initial
  // guess as the solution.
  CalcConstraintsPositionError (model, QInit, cs, e);
  if (e.norm() < tolerance) {
    Q = QInit;
    return true;
  }

  // We solve the linearized problem iteratively.
  // Iterations are stopped if the maximum is reached.
  for(unsigned int it = 0; it < max_iter; ++it) {
    // Compute the constraint jacobian and build A and b.
    constraintJac.setZero();
    CalcConstraintsJacobian (model, QInit, cs, constraintJac);
    A.block (model.dof_count, 0, cs.size(), model.dof_count) = constraintJac;
    A.block (0, model.dof_count, model.dof_count, cs.size())
      = constraintJac.transpose();
    b.block (model.dof_count, 0, cs.size(), 1) = -e;

    // Solve the sistem A*x = b.
    SolveLinearSystem (A, b, x, cs.linear_solver);

    // Extract the d = (Q - QInit) vector from x.
    d = x.block (0, 0, model.dof_count, 1);

    // Update solution.
    for (size_t i = 0; i < model.mJoints.size(); ++i) {
      // If the joint is spherical, translate the corresponding components
      // of d into a modification in the joint quaternion.
      if (model.mJoints[i].mJointType == JointTypeSpherical) {
        Quaternion quat = model.GetQuaternion(i, QInit);
        Vector3d omega = d.block<3,1>(model.mJoints[i].q_index,0);
        // Convert the 3d representation of the displacement to 4d and sum it
        // to the components of the quaternion.
        quat += quat.omegaToQDot(omega);
        // The quaternion needs to be normalized after the previous sum.
        quat /= quat.norm();
        model.SetQuaternion(i, quat, QInit);
      }
      // If the current joint is not spherical, simply add the corresponding
      // components of d to QInit.
      else {
        unsigned int qIdx = model.mJoints[i].q_index;
        for(size_t j = 0; j < model.mJoints[i].mDoFCount; ++j) {
          QInit[qIdx + j] += d[qIdx + j];
        }
      }
    }

    // Update the errors.
    CalcConstraintsPositionError (model, QInit, cs, e);

    // Check if the error and the step are small enough to end.
    if (e.norm() < tolerance && d.norm() < tolerance) {
      Q = QInit;
      return true;
    }
  }

  // Return false if maximum number of iterations is exceeded.
  Q = QInit;
  return false;
}